

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L_00;
  StkId pTVar1;
  TValue *pTVar2;
  TValue *io_1;
  TString *x_;
  TValue *io;
  TString *ts;
  TValue *o;
  lua_State *L;
  size_t l_local;
  char *str_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  io = (TValue *)luaS_newlstr(L_00,str,l);
  pTVar1 = L_00->top;
  L_00->top = pTVar1 + 1;
  if (9 < (((TString *)io)->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                  ,0x8c,"TString *luaX_newstring(LexState *, const char *, size_t)");
  }
  (pTVar1->value_).gc = (GCObject *)io;
  pTVar1->tt_ = ((TString *)io)->tt | 0x8000;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                    ,0x8c,"TString *luaX_newstring(LexState *, const char *, size_t)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_001468ce:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                    ,0x8c,"TString *luaX_newstring(LexState *, const char *, size_t)");
    }
    if (L_00 != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                      ,0x8c,"TString *luaX_newstring(LexState *, const char *, size_t)");
      }
      if ((((pTVar1->value_).gc)->marked & (L_00->l_G->currentwhite ^ 0x18)) != 0)
      goto LAB_001468ce;
    }
  }
  pTVar2 = luaH_set(L_00,ls->h,L_00->top + -1);
  if (pTVar2->tt_ == 0) {
    (pTVar2->value_).b = 1;
    pTVar2->tt_ = 1;
    if (0 < L_00->l_G->GCdebt) {
      luaC_step(L_00);
    }
  }
  else {
    if ((pTVar2[1].tt_ & 0xf) != 4) {
      __assert_fail("((((((((((const TValue*)((&(((Node *)(((char *)((o))) - __builtin_offsetof(Node, i_val))))->i_key.tvk))))))->tt_)) & 0x0F)) == (4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                    ,0x95,"TString *luaX_newstring(LexState *, const char *, size_t)");
    }
    if (((pTVar2[1].value_.gc)->tt & 0xf) != 4) {
      __assert_fail("((((((((const TValue*)((&(((Node *)(((char *)((o))) - __builtin_offsetof(Node, i_val))))->i_key.tvk)))))->value_).gc)->tt) & 0x0F) == 4"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                    ,0x95,"TString *luaX_newstring(LexState *, const char *, size_t)");
    }
    io = (TValue *)pTVar2[1].value_.gc;
  }
  L_00->top = L_00->top + -1;
  return (TString *)io;
}

Assistant:

TString *luaX_newstring (LexState *ls, const char *str, size_t l) {
  lua_State *L = ls->L;
  TValue *o;  /* entry for 'str' */
  TString *ts = luaS_newlstr(L, str, l);  /* create new string */
  setsvalue2s(L, L->top++, ts);  /* temporarily anchor it in stack */
  o = luaH_set(L, ls->h, L->top - 1);
  if (ttisnil(o)) {  /* not in use yet? */
    /* boolean value does not need GC barrier;
       table has no metatable, so it does not need to invalidate cache */
    setbvalue(o, 1);  /* t[string] = true */
    luaC_checkGC(L);
  }
  else {  /* string already present */
    ts = tsvalue(keyfromval(o));  /* re-use value previously stored */
  }
  L->top--;  /* remove string from stack */
  return ts;
}